

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

LOs __thiscall
Omega_h::find_unique(Omega_h *this,LOs *hv2v,Omega_h_Family family,Int high_dim,Int low_dim)

{
  Alloc *pAVar1;
  int *piVar2;
  long *plVar3;
  ulong uVar4;
  Alloc *pAVar5;
  ulong *puVar6;
  ulong *puVar7;
  undefined8 uVar8;
  void *extraout_RDX;
  Int deg;
  int iVar9;
  char *pcVar10;
  LOs LVar11;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  Read<signed_char> codes;
  Read<int> uv2v_canon;
  LOs sorted2u;
  LOs e2sorted;
  Read<signed_char> jumps;
  LOs uv2v;
  LOs e2u;
  ScopedTimer local_1d2;
  ScopedTimer local_1d1;
  Read<int> local_1d0;
  undefined1 local_1c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  void *pvStack_198;
  Alloc *local_190;
  Alloc *local_188;
  undefined1 local_180 [16];
  Alloc *local_170;
  undefined1 local_168 [24];
  Alloc *local_150;
  Alloc *local_148;
  Alloc *local_140;
  LOs local_138;
  Alloc *local_128;
  void *local_120;
  Read<int> local_118;
  LOs local_108;
  LOs local_f8;
  Read<signed_char> local_e8;
  Alloc *local_d8;
  void *local_d0;
  LOs local_c8;
  Alloc *local_b8;
  void *local_b0;
  Read<signed_char> local_a8;
  Alloc *local_98;
  LOs local_90;
  undefined1 local_80 [16];
  Write<int> local_70;
  LOs local_60;
  Alloc *local_50;
  Alloc *local_48;
  Read<int> local_40;
  
  local_170 = (Alloc *)(local_168 + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_170);
  local_1c0._16_8_ = local_1a8._M_local_buf + 8;
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_1a8._8_8_ = *puVar6;
    pvStack_198 = (void *)plVar3[3];
  }
  else {
    local_1a8._8_8_ = *puVar6;
    local_1c0._16_8_ = (ulong *)*plVar3;
  }
  local_1a8._M_allocated_capacity = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_1d0.write_.shared_alloc_.alloc = (Alloc *)local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d0.write_.shared_alloc_.alloc,3,0x92);
  uVar8 = 0xf;
  if ((char *)local_1c0._16_8_ != local_1a8._M_local_buf + 8) {
    uVar8 = local_1a8._8_8_;
  }
  if ((ulong)uVar8 <
      (long)local_1d0.write_.shared_alloc_.direct_ptr + local_1a8._M_allocated_capacity) {
    uVar4 = 0xf;
    if (local_1d0.write_.shared_alloc_.alloc != (Alloc *)local_1c0) {
      uVar4 = local_1c0._0_8_;
    }
    if (uVar4 < (long)local_1d0.write_.shared_alloc_.direct_ptr + local_1a8._M_allocated_capacity)
    goto LAB_001c7735;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,local_1c0._16_8_)
    ;
  }
  else {
LAB_001c7735:
    plVar3 = (long *)std::__cxx11::string::_M_append
                               (local_1c0 + 0x10,(ulong)local_1d0.write_.shared_alloc_.alloc);
  }
  local_190 = (Alloc *)local_180;
  pAVar1 = (Alloc *)(plVar3 + 2);
  if ((Alloc *)*plVar3 == pAVar1) {
    local_180._0_8_ = pAVar1->size;
    local_180._8_8_ = plVar3[3];
  }
  else {
    local_180._0_8_ = pAVar1->size;
    local_190 = (Alloc *)*plVar3;
  }
  local_188 = (Alloc *)plVar3[1];
  *plVar3 = (long)pAVar1;
  plVar3[1] = 0;
  *(undefined1 *)&pAVar1->size = 0;
  local_98 = (Alloc *)this;
  begin_code("find_unique",(char *)local_190);
  if (local_190 != (Alloc *)local_180) {
    operator_delete(local_190,(ulong)((long)(size_t *)local_180._0_8_ + 1));
  }
  if (local_1d0.write_.shared_alloc_.alloc != (Alloc *)local_1c0) {
    operator_delete(local_1d0.write_.shared_alloc_.alloc,local_1c0._0_8_ + 1);
  }
  if ((char *)local_1c0._16_8_ != local_1a8._M_local_buf + 8) {
    operator_delete((void *)local_1c0._16_8_,local_1a8._8_8_ + 1);
  }
  if (local_170 != (Alloc *)(local_168 + 8)) {
    operator_delete(local_170,local_168._8_8_ + 1);
  }
  if (high_dim <= low_dim) {
    uVar8 = 0x93;
    pcVar10 = "high_dim > low_dim";
LAB_001c8429:
    fail("assertion %s failed at %s +%d\n",pcVar10,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,uVar8);
  }
  if (2 < low_dim) {
    uVar8 = 0x94;
    pcVar10 = "low_dim <= 2";
    goto LAB_001c8429;
  }
  local_90.write_.shared_alloc_.alloc = (hv2v->write_).shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 1) == 0) {
    uVar4 = (local_90.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar4 = (ulong)local_90.write_.shared_alloc_.alloc >> 3;
  }
  if (family == OMEGA_H_SIMPLEX) {
    iVar9 = -1;
    if ((uint)high_dim < 4) {
      iVar9 = high_dim + 1;
    }
  }
  else {
    iVar9 = -1;
    if ((uint)high_dim < 4) {
      iVar9 = *(int *)(&DAT_0044eba8 + (ulong)(uint)high_dim * 4);
    }
  }
  if ((int)((long)((ulong)(uint)((int)(uVar4 >> 2) >> 0x1f) << 0x20 | uVar4 >> 2 & 0xffffffff) %
           (long)iVar9) != 0) {
    uVar8 = 0x95;
    pcVar10 = "hv2v.size() % element_degree(family, high_dim, VERT) == 0";
    goto LAB_001c8429;
  }
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc =
           (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.write_.shared_alloc_.alloc)->use_count =
           (local_90.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = (hv2v->write_).shared_alloc_.direct_ptr;
  form_uses((Omega_h *)local_80,&local_90,family,high_dim,low_dim);
  pAVar1 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  if (family == OMEGA_H_SIMPLEX) {
    deg = -1;
    if ((uint)low_dim < 4) {
      deg = low_dim + 1;
    }
  }
  else {
    deg = -1;
    if ((uint)low_dim < 4) {
      deg = *(Int *)(&DAT_0044eba8 + (ulong)(uint)low_dim * 4);
    }
  }
  local_150 = (Alloc *)local_80._0_8_;
  if ((local_80._0_8_ & 7) == 0 && (Alloc *)local_80._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_150 = (Alloc *)(*(size_t *)local_80._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_80._0_8_ + 0x30) = *(int *)(local_80._0_8_ + 0x30) + 1;
    }
  }
  local_148 = (Alloc *)local_80._8_8_;
  local_170 = (Alloc *)(local_168 + 8);
  local_1d0.write_.shared_alloc_.alloc = (Alloc *)0x5d;
  local_140 = (Alloc *)local_80;
  pAVar5 = (Alloc *)std::__cxx11::string::_M_create((ulong *)&local_170,(ulong)&local_1d0);
  pAVar1 = local_1d0.write_.shared_alloc_.alloc;
  local_168._8_8_ = local_1d0.write_.shared_alloc_.alloc;
  local_170 = pAVar5;
  memcpy(pAVar5,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,0x5d);
  local_168._0_8_ = pAVar1;
  *(undefined1 *)((long)&pAVar1->size + (long)&pAVar5->size) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar6 = (ulong *)(local_1a8._M_local_buf + 8);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_1a8._8_8_ = *puVar7;
    pvStack_198 = (void *)plVar3[3];
    local_1c0._16_8_ = puVar6;
  }
  else {
    local_1a8._8_8_ = *puVar7;
    local_1c0._16_8_ = (ulong *)*plVar3;
  }
  local_1a8._M_allocated_capacity = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_1d0.write_.shared_alloc_.alloc = (Alloc *)local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d0.write_.shared_alloc_.alloc,3,0x86);
  uVar8 = 0xf;
  if ((ulong *)local_1c0._16_8_ != puVar6) {
    uVar8 = local_1a8._8_8_;
  }
  if ((ulong)uVar8 <
      (long)local_1d0.write_.shared_alloc_.direct_ptr + local_1a8._M_allocated_capacity) {
    uVar4 = 0xf;
    if (local_1d0.write_.shared_alloc_.alloc != (Alloc *)local_1c0) {
      uVar4 = local_1c0._0_8_;
    }
    if ((long)local_1d0.write_.shared_alloc_.direct_ptr + local_1a8._M_allocated_capacity <= uVar4)
    {
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_1d0,0,(char *)0x0,local_1c0._16_8_);
      goto LAB_001c7ae3;
    }
  }
  plVar3 = (long *)std::__cxx11::string::_M_append
                             (local_1c0 + 0x10,(ulong)local_1d0.write_.shared_alloc_.alloc);
LAB_001c7ae3:
  pAVar1 = (Alloc *)(plVar3 + 2);
  if ((Alloc *)*plVar3 == pAVar1) {
    local_180._0_8_ = pAVar1->size;
    local_180._8_8_ = plVar3[3];
    local_190 = (Alloc *)local_180;
  }
  else {
    local_180._0_8_ = pAVar1->size;
    local_190 = (Alloc *)*plVar3;
  }
  local_188 = (Alloc *)plVar3[1];
  *plVar3 = (long)pAVar1;
  plVar3[1] = 0;
  *(undefined1 *)&pAVar1->size = 0;
  begin_code("find_unique_deg",(char *)local_190);
  if (local_190 != (Alloc *)local_180) {
    operator_delete(local_190,(ulong)((long)(size_t *)local_180._0_8_ + 1));
  }
  if (local_1d0.write_.shared_alloc_.alloc != (Alloc *)local_1c0) {
    operator_delete(local_1d0.write_.shared_alloc_.alloc,local_1c0._0_8_ + 1);
  }
  if ((ulong *)local_1c0._16_8_ != puVar6) {
    operator_delete((void *)local_1c0._16_8_,local_1a8._8_8_ + 1);
  }
  if (local_170 != (Alloc *)(local_168 + 8)) {
    operator_delete(local_170,(ulong)(local_168._8_8_ + 1));
  }
  local_1c0._16_8_ = local_150;
  if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c0._16_8_ = local_150->size * 8 + 1;
    }
    else {
      local_150->use_count = local_150->use_count + 1;
    }
  }
  local_1a8._M_allocated_capacity = (size_type)local_148;
  get_codes_to_canonical<int>((Omega_h *)&local_190,deg,(Read<int> *)(local_1c0 + 0x10));
  uVar8 = local_1c0._16_8_;
  if ((local_1c0._16_8_ & 7) == 0 && (Alloc *)local_1c0._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_1c0._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_1c0._16_8_);
      operator_delete((void *)uVar8,0x48);
    }
  }
  local_1d0.write_.shared_alloc_.alloc = local_150;
  if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d0.write_.shared_alloc_.alloc = (Alloc *)(local_150->size * 8 + 1);
    }
    else {
      local_150->use_count = local_150->use_count + 1;
    }
  }
  local_1d0.write_.shared_alloc_.direct_ptr = local_148;
  local_a8.write_.shared_alloc_.alloc = local_190;
  if (((ulong)local_190 & 7) == 0 && local_190 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.write_.shared_alloc_.alloc = (Alloc *)(local_190->size * 8 + 1);
    }
    else {
      local_190->use_count = local_190->use_count + 1;
    }
  }
  local_a8.write_.shared_alloc_.direct_ptr = local_188;
  align_ev2v<int>((Omega_h *)&local_170,deg,&local_1d0,&local_a8);
  pAVar1 = local_a8.write_.shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar1);
      operator_delete(pAVar1,0x48);
    }
  }
  pAVar1 = local_1d0.write_.shared_alloc_.alloc;
  if (((ulong)local_1d0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1d0.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1d0.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  local_40.write_.shared_alloc_.alloc = local_170;
  if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.write_.shared_alloc_.alloc = (Alloc *)(local_170->size * 8 + 1);
    }
    else {
      local_170->use_count = local_170->use_count + 1;
    }
  }
  local_40.write_.shared_alloc_.direct_ptr = (void *)local_168._0_8_;
  sort_by_keys<int>((Omega_h *)&local_128,&local_40,deg);
  pAVar1 = local_40.write_.shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  local_138.write_.shared_alloc_.alloc = local_170;
  if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138.write_.shared_alloc_.alloc = (Alloc *)(local_170->size * 8 + 1);
    }
    else {
      local_170->use_count = local_170->use_count + 1;
    }
  }
  local_138.write_.shared_alloc_.direct_ptr = (void *)local_168._0_8_;
  local_c8.write_.shared_alloc_.alloc = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8.write_.shared_alloc_.alloc = (Alloc *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  local_c8.write_.shared_alloc_.direct_ptr = local_120;
  find_canonical_jumps((Omega_h *)&local_b8,deg,&local_138,&local_c8);
  pAVar1 = local_c8.write_.shared_alloc_.alloc;
  if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  pAVar1 = local_138.write_.shared_alloc_.alloc;
  if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
      local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_138.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  local_e8.write_.shared_alloc_.alloc = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8.write_.shared_alloc_.alloc = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  local_e8.write_.shared_alloc_.direct_ptr = local_b0;
  collect_marked((Omega_h *)&local_d8,&local_e8);
  pAVar1 = local_e8.write_.shared_alloc_.alloc;
  if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_e8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_e8.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  local_f8.write_.shared_alloc_.alloc = local_d8;
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.write_.shared_alloc_.alloc = (Alloc *)(local_d8->size * 8 + 1);
    }
    else {
      local_d8->use_count = local_d8->use_count + 1;
    }
  }
  local_f8.write_.shared_alloc_.direct_ptr = local_d0;
  local_60.write_.shared_alloc_.alloc = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc = (Alloc *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = local_120;
  compound_maps((Omega_h *)&local_50,&local_f8,&local_60);
  pAVar1 = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = (int *)((long)local_60.write_.shared_alloc_.alloc + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  pAVar5 = local_98;
  pAVar1 = local_f8.write_.shared_alloc_.alloc;
  if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_f8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  local_108.write_.shared_alloc_.alloc = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_108.write_.shared_alloc_.direct_ptr = local_48;
  local_118.write_.shared_alloc_.alloc = local_150;
  if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.write_.shared_alloc_.alloc = (Alloc *)(local_150->size * 8 + 1);
    }
    else {
      local_150->use_count = local_150->use_count + 1;
    }
  }
  local_118.write_.shared_alloc_.direct_ptr = local_148;
  unmap<int>((Omega_h *)&local_70,&local_108,&local_118,deg);
  Read<int>::Read((Read<signed_char> *)pAVar5,&local_70);
  if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 && local_70.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_70.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_70.shared_alloc_.alloc);
      operator_delete(local_70.shared_alloc_.alloc,0x48);
    }
  }
  pAVar1 = local_118.write_.shared_alloc_.alloc;
  if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_118.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_118.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  pAVar1 = local_108.write_.shared_alloc_.alloc;
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_108.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar2 = &local_50->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(local_50,0x48);
    }
  }
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    piVar2 = &local_d8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_d8);
      operator_delete(local_d8,0x48);
    }
  }
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    piVar2 = &local_b8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b8);
      operator_delete(local_b8,0x48);
    }
  }
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    piVar2 = &local_128->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_128);
      operator_delete(local_128,0x48);
    }
  }
  pAVar1 = local_170;
  if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
    piVar2 = &local_170->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_170);
      operator_delete(pAVar1,0x48);
    }
  }
  pAVar1 = local_190;
  if (((ulong)local_190 & 7) == 0 && local_190 != (Alloc *)0x0) {
    piVar2 = &local_190->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_190);
      operator_delete(pAVar1,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_1d1);
  pAVar1 = local_150;
  if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
    piVar2 = &local_150->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_150);
      operator_delete(pAVar1,0x48);
    }
  }
  if ((local_80._0_8_ & 7) == 0 && (Alloc *)local_80._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_80._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_80._0_8_);
      operator_delete((void *)local_80._0_8_,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_1d2);
  LVar11.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar11.write_.shared_alloc_.alloc = pAVar5;
  return (LOs)LVar11.write_.shared_alloc_;
}

Assistant:

LOs find_unique(LOs const hv2v, Omega_h_Family const family, Int const high_dim,
    Int const low_dim) {
  OMEGA_H_TIME_FUNCTION;
  OMEGA_H_CHECK(high_dim > low_dim);
  OMEGA_H_CHECK(low_dim <= 2);
  OMEGA_H_CHECK(hv2v.size() % element_degree(family, high_dim, VERT) == 0);
  auto const uv2v = form_uses(hv2v, family, high_dim, low_dim);
  auto const deg = element_degree(family, low_dim, VERT);
  return find_unique_deg(deg, uv2v);
}